

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::publicshare_dir(void)

{
  Path *in_RDI;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"PUBLICSHARE",&local_51);
  get_xdg_userdir_setting(&local_50,&local_30);
  Path(in_RDI,&local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

Path Path::publicshare_dir()
{
#if defined(_PATHIE_UNIX)
  return Path(get_xdg_userdir_setting("PUBLICSHARE"));
#elif defined(_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_NETHOOD, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));
#else
#error Unsupported system.
#endif
}